

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error storeEntityValue(XML_Parser parser,ENCODING *enc,char *entityTextPtr,char *entityTextEnd,
                          XML_Account account)

{
  XML_Char XVar1;
  DTD *pDVar2;
  XML_Bool XVar3;
  int iVar4;
  STRING_POOL *pool_00;
  XML_Char *pXVar5;
  int local_64;
  int n;
  int i;
  XML_Char buf [4];
  int tok;
  char *next;
  XML_Error result;
  STRING_POOL *pool;
  DTD *dtd;
  XML_Account account_local;
  char *entityTextEnd_local;
  char *entityTextPtr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  pDVar2 = parser->m_dtd;
  pool_00 = &pDVar2->entityValuePool;
  entityTextEnd_local = entityTextPtr;
  if ((pool_00->blocks == (BLOCK *)0x0) && (XVar3 = poolGrow(pool_00), XVar3 == '\0')) {
    return XML_ERROR_NO_MEMORY;
  }
  do {
    _buf = entityTextEnd_local;
    i = (*enc->literalScanners[1])(enc,entityTextEnd_local,entityTextEnd,(char **)buf);
    switch(i) {
    case 0:
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = _buf;
      }
      return XML_ERROR_INVALID_TOKEN;
    case 6:
    case 9:
      pXVar5 = poolAppend(pool_00,enc,entityTextEnd_local,_buf);
      if (pXVar5 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 10:
      iVar4 = (*enc->charRefNumber)(enc,entityTextEnd_local);
      if (iVar4 < 0) {
        if (enc == parser->m_encoding) {
          parser->m_eventPtr = entityTextEnd_local;
        }
        return XML_ERROR_BAD_CHAR_REF;
      }
      iVar4 = XmlUtf8Encode(iVar4,(char *)&n);
      for (local_64 = 0; local_64 < iVar4; local_64 = local_64 + 1) {
        if (((pDVar2->entityValuePool).end == (pDVar2->entityValuePool).ptr) &&
           (XVar3 = poolGrow(pool_00), XVar3 == '\0')) {
          return XML_ERROR_NO_MEMORY;
        }
        XVar1 = *(XML_Char *)((long)&n + (long)local_64);
        pXVar5 = (pDVar2->entityValuePool).ptr;
        (pDVar2->entityValuePool).ptr = pXVar5 + 1;
        *pXVar5 = XVar1;
      }
      break;
    case 0x1c:
      parser->m_eventPtr = entityTextEnd_local;
      return XML_ERROR_PARAM_ENTITY_REF;
    case -4:
      return XML_ERROR_NONE;
    case -3:
      _buf = entityTextEnd_local + enc->minBytesPerChar;
    case 7:
      if (((pDVar2->entityValuePool).end == (pDVar2->entityValuePool).ptr) &&
         (XVar3 = poolGrow(pool_00), XVar3 == '\0')) {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar5 = (pDVar2->entityValuePool).ptr;
      (pDVar2->entityValuePool).ptr = pXVar5 + 1;
      *pXVar5 = '\n';
      break;
    default:
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = entityTextEnd_local;
      }
      return XML_ERROR_UNEXPECTED_STATE;
    case -1:
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = entityTextEnd_local;
      }
      return XML_ERROR_INVALID_TOKEN;
    }
    entityTextEnd_local = _buf;
  } while( true );
}

Assistant:

static enum XML_Error
storeEntityValue(XML_Parser parser, const ENCODING *enc,
                 const char *entityTextPtr, const char *entityTextEnd,
                 enum XML_Account account) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  STRING_POOL *pool = &(dtd->entityValuePool);
  enum XML_Error result = XML_ERROR_NONE;
#ifdef XML_DTD
  int oldInEntityValue = parser->m_prologState.inEntityValue;
  parser->m_prologState.inEntityValue = 1;
#else
  UNUSED_P(account);
#endif /* XML_DTD */
  /* never return Null for the value argument in EntityDeclHandler,
     since this would indicate an external entity; therefore we
     have to make sure that entityValuePool.start is not null */
  if (! pool->blocks) {
    if (! poolGrow(pool))
      return XML_ERROR_NO_MEMORY;
  }

  for (;;) {
    const char *next
        = entityTextPtr; /* XmlEntityValueTok doesn't always set the last arg */
    int tok = XmlEntityValueTok(enc, entityTextPtr, entityTextEnd, &next);

#ifdef XML_DTD
    if (! accountingDiffTolerated(parser, tok, entityTextPtr, next, __LINE__,
                                  account)) {
      accountingOnAbort(parser);
      result = XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
      goto endEntityValue;
    }
#endif

    switch (tok) {
    case XML_TOK_PARAM_ENTITY_REF:
#ifdef XML_DTD
      if (parser->m_isParamEntity || enc != parser->m_encoding) {
        const XML_Char *name;
        ENTITY *entity;
        name = poolStoreString(&parser->m_tempPool, enc,
                               entityTextPtr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (! name) {
          result = XML_ERROR_NO_MEMORY;
          goto endEntityValue;
        }
        entity = (ENTITY *)lookup(parser, &dtd->paramEntities, name, 0);
        poolDiscard(&parser->m_tempPool);
        if (! entity) {
          /* not a well-formedness error - see XML 1.0: WFC Entity Declared */
          /* cannot report skipped entity here - see comments on
             parser->m_skippedEntityHandler
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          */
          dtd->keepProcessing = dtd->standalone;
          goto endEntityValue;
        }
        if (entity->open) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = entityTextPtr;
          result = XML_ERROR_RECURSIVE_ENTITY_REF;
          goto endEntityValue;
        }
        if (entity->systemId) {
          if (parser->m_externalEntityRefHandler) {
            dtd->paramEntityRead = XML_FALSE;
            entity->open = XML_TRUE;
            entityTrackingOnOpen(parser, entity, __LINE__);
            if (! parser->m_externalEntityRefHandler(
                    parser->m_externalEntityRefHandlerArg, 0, entity->base,
                    entity->systemId, entity->publicId)) {
              entityTrackingOnClose(parser, entity, __LINE__);
              entity->open = XML_FALSE;
              result = XML_ERROR_EXTERNAL_ENTITY_HANDLING;
              goto endEntityValue;
            }
            entityTrackingOnClose(parser, entity, __LINE__);
            entity->open = XML_FALSE;
            if (! dtd->paramEntityRead)
              dtd->keepProcessing = dtd->standalone;
          } else
            dtd->keepProcessing = dtd->standalone;
        } else {
          entity->open = XML_TRUE;
          entityTrackingOnOpen(parser, entity, __LINE__);
          result = storeEntityValue(
              parser, parser->m_internalEncoding, (const char *)entity->textPtr,
              (const char *)(entity->textPtr + entity->textLen),
              XML_ACCOUNT_ENTITY_EXPANSION);
          entityTrackingOnClose(parser, entity, __LINE__);
          entity->open = XML_FALSE;
          if (result)
            goto endEntityValue;
        }
        break;
      }
#endif /* XML_DTD */
      /* In the internal subset, PE references are not legal
         within markup declarations, e.g entity values in this case. */
      parser->m_eventPtr = entityTextPtr;
      result = XML_ERROR_PARAM_ENTITY_REF;
      goto endEntityValue;
    case XML_TOK_NONE:
      result = XML_ERROR_NONE;
      goto endEntityValue;
    case XML_TOK_ENTITY_REF:
    case XML_TOK_DATA_CHARS:
      if (! poolAppend(pool, enc, entityTextPtr, next)) {
        result = XML_ERROR_NO_MEMORY;
        goto endEntityValue;
      }
      break;
    case XML_TOK_TRAILING_CR:
      next = entityTextPtr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_DATA_NEWLINE:
      if (pool->end == pool->ptr && ! poolGrow(pool)) {
        result = XML_ERROR_NO_MEMORY;
        goto endEntityValue;
      }
      *(pool->ptr)++ = 0xA;
      break;
    case XML_TOK_CHAR_REF: {
      XML_Char buf[XML_ENCODE_MAX];
      int i;
      int n = XmlCharRefNumber(enc, entityTextPtr);
      if (n < 0) {
        if (enc == parser->m_encoding)
          parser->m_eventPtr = entityTextPtr;
        result = XML_ERROR_BAD_CHAR_REF;
        goto endEntityValue;
      }
      n = XmlEncode(n, (ICHAR *)buf);
      /* The XmlEncode() functions can never return 0 here.  That
       * error return happens if the code point passed in is either
       * negative or greater than or equal to 0x110000.  The
       * XmlCharRefNumber() functions will all return a number
       * strictly less than 0x110000 or a negative value if an error
       * occurred.  The negative value is intercepted above, so
       * XmlEncode() is never passed a value it might return an
       * error for.
       */
      for (i = 0; i < n; i++) {
        if (pool->end == pool->ptr && ! poolGrow(pool)) {
          result = XML_ERROR_NO_MEMORY;
          goto endEntityValue;
        }
        *(pool->ptr)++ = buf[i];
      }
    } break;
    case XML_TOK_PARTIAL:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = entityTextPtr;
      result = XML_ERROR_INVALID_TOKEN;
      goto endEntityValue;
    case XML_TOK_INVALID:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = next;
      result = XML_ERROR_INVALID_TOKEN;
      goto endEntityValue;
    default:
      /* This default case should be unnecessary -- all the tokens
       * that XmlEntityValueTok() can return have their own explicit
       * cases -- but should be retained for safety.  We do however
       * exclude it from the coverage statistics.
       *
       * LCOV_EXCL_START
       */
      if (enc == parser->m_encoding)
        parser->m_eventPtr = entityTextPtr;
      result = XML_ERROR_UNEXPECTED_STATE;
      goto endEntityValue;
      /* LCOV_EXCL_STOP */
    }
    entityTextPtr = next;
  }
endEntityValue:
#ifdef XML_DTD
  parser->m_prologState.inEntityValue = oldInEntityValue;
#endif /* XML_DTD */
  return result;
}